

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::emplace<EnumNameValue_const&>
          (QGenericArrayOps<EnumNameValue> *this,qsizetype i,EnumNameValue *args)

{
  EnumNameValue **ppEVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_b8;
  EnumNameValue tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<EnumNameValue>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<EnumNameValue>).size == i) {
      qVar5 = QArrayDataPointer<EnumNameValue>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<EnumNameValue>);
      if (qVar5 == 0) goto LAB_0010a6eb;
      EnumNameValue::EnumNameValue
                ((this->super_QArrayDataPointer<EnumNameValue>).ptr +
                 (this->super_QArrayDataPointer<EnumNameValue>).size,args);
LAB_0010a80a:
      pqVar2 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0010a7c3;
    }
LAB_0010a6eb:
    if (i == 0) {
      qVar5 = QArrayDataPointer<EnumNameValue>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<EnumNameValue>);
      if (qVar5 != 0) {
        EnumNameValue::EnumNameValue((this->super_QArrayDataPointer<EnumNameValue>).ptr + -1,args);
        ppEVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).ptr;
        *ppEVar1 = *ppEVar1 + -1;
        goto LAB_0010a80a;
      }
    }
  }
  tmp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.valueStr.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.valueStr.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.valueStr.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  EnumNameValue::EnumNameValue(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<EnumNameValue>).size != 0;
  QArrayDataPointer<EnumNameValue>::detachAndGrow
            (&this->super_QArrayDataPointer<EnumNameValue>,(uint)(i == 0 && bVar6),1,
             (EnumNameValue **)0x0,(QArrayDataPointer<EnumNameValue> *)0x0);
  if (i == 0 && bVar6) {
    EnumNameValue::EnumNameValue((this->super_QArrayDataPointer<EnumNameValue>).ptr + -1,&tmp);
    ppEVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).ptr;
    *ppEVar1 = *ppEVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_b8.sourceCopyConstruct = 0;
    local_b8.nSource = 0;
    local_b8.move = 0;
    local_b8.sourceCopyAssign = 0;
    local_b8.end = (EnumNameValue *)0x0;
    local_b8.last = (EnumNameValue *)0x0;
    local_b8.where = (EnumNameValue *)0x0;
    local_b8.begin = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
    local_b8.size = (this->super_QArrayDataPointer<EnumNameValue>).size;
    local_b8.data = &this->super_QArrayDataPointer<EnumNameValue>;
    Inserter::insertOne(&local_b8,i,&tmp);
    (local_b8.data)->ptr = local_b8.begin;
    (local_b8.data)->size = local_b8.size;
  }
  EnumNameValue::~EnumNameValue(&tmp);
LAB_0010a7c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }